

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# components.hpp
# Opt level: O0

void __thiscall
cs::stack_type<cs_impl::any,_std::allocator>::pop_no_return
          (stack_type<cs_impl::any,_std::allocator> *this)

{
  bool bVar1;
  string *str;
  stack_type<cs_impl::any,_std::allocator> *in_RDI;
  error *this_00;
  undefined1 local_29 [41];
  
  bVar1 = empty(in_RDI);
  if (!bVar1) {
    cs_impl::any::~any((any *)0x5400df);
    in_RDI->m_current = in_RDI->m_current + -1;
    return;
  }
  str = (string *)__cxa_allocate_exception(0x28);
  this_00 = (error *)local_29;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_29 + 1),"E000H",(allocator *)this_00);
  cov::error::error(this_00,str);
  __cxa_throw(str,&cov::error::typeinfo,cov::error::~error);
}

Assistant:

inline void pop_no_return()
		{
			if (empty())
				throw cov::error("E000H");
			(m_current - 1)->~T();
			--m_current;
		}